

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::ExclusiveJoinPromiseNode> __thiscall
kj::heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params,Own<kj::_::PromiseNode> *params_1)

{
  ExclusiveJoinPromiseNode *this_00;
  ExclusiveJoinPromiseNode *extraout_RDX;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar1;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  this_00 = (ExclusiveJoinPromiseNode *)operator_new(0x90);
  local_38.disposer = params->disposer;
  local_38.ptr = params->ptr;
  params->ptr = (PromiseNode *)0x0;
  local_48.disposer = params_1->disposer;
  local_48.ptr = params_1->ptr;
  params_1->ptr = (PromiseNode *)0x0;
  _::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(this_00,&local_38,&local_48);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::ExclusiveJoinPromiseNode>::instance;
  *(ExclusiveJoinPromiseNode **)(this + 8) = this_00;
  Own<kj::_::PromiseNode>::dispose(&local_48);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}